

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::SetBufferRange(ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *this,IDeviceObject *pObject,Uint64 Offset,Uint64 Size,Uint32 ArrayIndex,
                SET_SHADER_RESOURCE_FLAGS Flags)

{
  PipelineResourceDesc *pPVar1;
  string msg;
  undefined1 local_50 [32];
  
  pPVar1 = ShaderVariableManagerGL::GetResourceDesc(this->m_ParentManager,this->m_ResIndex);
  if (pPVar1->ResourceType != SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
    FormatString<char[55]>
              ((string *)local_50,
               (char (*) [55])"SetBufferRange() is only allowed for constant buffers.");
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"SetBufferRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2b7);
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
  }
  local_50._0_8_ = pObject;
  local_50._8_4_ = Flags;
  local_50._12_4_ = ArrayIndex;
  local_50._16_8_ = Offset;
  local_50._24_8_ = Size;
  ShaderVariableManagerGL::ImageBindInfo::BindResource
            ((ImageBindInfo *)this,(BindResourceInfo *)local_50);
  return;
}

Assistant:

SetBufferRange(IDeviceObject*            pObject,
                                                   Uint64                    Offset,
                                                   Uint64                    Size,
                                                   Uint32                    ArrayIndex,
                                                   SET_SHADER_RESOURCE_FLAGS Flags) override
    {
        DEV_CHECK_ERR(GetDesc().ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER, "SetBufferRange() is only allowed for constant buffers.");
        static_cast<ThisImplType*>(this)->BindResource(BindResourceInfo{ArrayIndex, pObject, Flags, Offset, Size});
    }